

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O0

void __thiscall
QLocalSocketPrivate::describeSocket(QLocalSocketPrivate *this,qintptr socketDescriptor)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  parameter_type pQVar4;
  bool *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int getpeernameStatus;
  SocketOptions options;
  socklen_t len;
  bool abstractAddress;
  sockaddr_un addr;
  parameter_type in_stack_ffffffffffffff58;
  QString *serverName;
  undefined4 in_stack_ffffffffffffff80;
  socklen_t sVar5;
  undefined1 local_76 [2];
  uint in_stack_ffffffffffffff8c;
  sockaddr_un *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  serverName = in_RDI;
  memset(local_76,0xaa,0x6e);
  sVar5 = 0x6e;
  memset(local_76,0,0x6e);
  iVar3 = getpeername((int)in_RSI,(sockaddr *)local_76,(socklen_t *)&stack0xffffffffffffff84);
  if ((iVar3 != 0) || (sVar5 == 2)) {
    sVar5 = 0x6e;
    iVar3 = getsockname((int)in_RSI,(sockaddr *)local_76,(socklen_t *)&stack0xffffffffffffff84);
    if (iVar3 != 0) goto LAB_00388960;
  }
  bVar2 = parseSockaddr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                        (QString *)CONCAT44(sVar5,in_stack_ffffffffffffff80),serverName,in_RSI);
  if (bVar2) {
    pQVar4 = QObjectBindableProperty<QLocalSocketPrivate,_QFlags<QLocalSocket::SocketOption>,_&QLocalSocketPrivate::_qt_property_socketOptions_offset,_nullptr>
             ::value((QObjectBindableProperty<QLocalSocketPrivate,_QFlags<QLocalSocket::SocketOption>,_&QLocalSocketPrivate::_qt_property_socketOptions_offset,_nullptr>
                      *)in_RDI);
    QFlags<QLocalSocket::SocketOption>::setFlag
              ((QFlags<QLocalSocket::SocketOption> *)
               CONCAT44(sVar5,(pQVar4->super_QFlagsStorageHelper<QLocalSocket::SocketOption,_4>).
                              super_QFlagsStorage<QLocalSocket::SocketOption>.i),
               (SocketOption)((ulong)serverName >> 0x20),SUB81((ulong)serverName >> 0x18,0));
    QObjectBindableProperty<QLocalSocketPrivate,_QFlags<QLocalSocket::SocketOption>,_&QLocalSocketPrivate::_qt_property_socketOptions_offset,_nullptr>
    ::operator=((QObjectBindableProperty<QLocalSocketPrivate,_QFlags<QLocalSocket::SocketOption>,_&QLocalSocketPrivate::_qt_property_socketOptions_offset,_nullptr>
                 *)in_RDI,in_stack_ffffffffffffff58);
  }
LAB_00388960:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLocalSocketPrivate::describeSocket(qintptr socketDescriptor)
{
    bool abstractAddress = false;

    struct ::sockaddr_un addr;
    QT_SOCKLEN_T len = sizeof(addr);
    memset(&addr, 0, sizeof(addr));
    const int getpeernameStatus = ::getpeername(socketDescriptor, (sockaddr *)&addr, &len);
    if (getpeernameStatus != 0 || len == offsetof(sockaddr_un, sun_path)) {
        // this is the case when we call it from QLocalServer, then there is no peername
        len = sizeof(addr);
        if (::getsockname(socketDescriptor, (sockaddr *)&addr, &len) != 0)
            return;
    }
    if (parseSockaddr(addr, static_cast<uint>(len), fullServerName, serverName, abstractAddress)) {
        QLocalSocket::SocketOptions options = socketOptions.value();
        socketOptions = options.setFlag(QLocalSocket::AbstractNamespaceOption, abstractAddress);
    }
}